

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O1

void __thiscall CDesign::Report(CDesign *this,char *pName)

{
  undefined1 *__s;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  double dVar7;
  char cCmd [512];
  char cName [512];
  
  __s = &(this->super_CBBox).field_0x14;
  sVar6 = strlen(__s);
  if (5 < sVar6) {
    sprintf(cName,">%s.rpt",&this->field_0x634);
    CObject::PrintFile(&this->super_CObject,cName,0);
    CObject::PrintFile(&this->super_CObject,cName,0x20);
    sprintf(cCmd,"cat %s >> %s",cName + 1,&this->field_0x634);
    system(cCmd);
    uVar1 = this->m_iBestOF;
    uVar2 = this->m_iBestWL;
    uVar3 = this->m_iBestVia;
    iVar4 = *(int *)&this->field_0xc34;
    dVar7 = StopWatch(0);
    iVar5 = GetMemory();
    sprintf(cCmd,"mail %s -s \"%s OF=%d WL:%d VIA:%d=%d in %.1f sec (%.1f MB)\" < %s",dVar7,
            (double)iVar5 * 0.0009765625,__s,pName,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
            (ulong)(iVar4 * uVar3 + uVar2),cName + 1);
    system(cCmd);
    CObject::Display(4,"%s\n",cCmd);
  }
  return;
}

Assistant:

void CDesign::Report(char* pName)
{
	if(strlen(m_Param.m_cEmail)>5)
	{
		char	cName[MAX_BUFFER_STR];
		sprintf(cName,">%s.rpt",m_Param.m_cOutput_File);

		PrintFile(cName,PRINT_MODE_TEXT);
		PrintFile(cName,PRINT_MODE_CONGET);

		char	cCmd[MAX_BUFFER_STR];
		sprintf(cCmd,"cat %s >> %s",cName+1,m_Param.m_cOutput_File);
		system(cCmd);

		sprintf(cCmd,"mail %s -s \"%s OF=%d WL:%d VIA:%d=%d in %.1f sec (%.1f MB)\" < %s",
			m_Param.m_cEmail,pName,m_iBestOF,m_iBestWL,m_iBestVia,
			m_iBestWL+m_iBestVia*m_Param.m_iViaCost,			
			StopWatch(STOPWATCH_OPTION_SET),GetMemory()/1024.0,cName+1);
#ifndef WIN32
		system(cCmd);
#endif
		Display(DISPLAY_MODE_EXEC,"%s\n",cCmd);
	}
}